

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall ON_RenderingAttributes::Read(ON_RenderingAttributes *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int major_version;
  int minor_version;
  int local_28 [2];
  
  bVar2 = false;
  ON_ClassArray<ON_MaterialRef>::SetCapacity(&this->m_materials,0);
  local_28[0] = 0;
  local_28[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_28,local_28 + 1);
  if (bVar1) {
    bVar1 = local_28[0] == 1;
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadArray(archive,&this->m_materials);
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_RenderingAttributes::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if (!rc)
    return false;
  for(;;)
  {
    rc = ( 1 == major_version );
    if (!rc) break;
    rc = archive.ReadArray(m_materials);
    if (!rc) break;

    break;
  }
  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}